

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O2

void __thiscall Tank::serverLoop(Tank *this)

{
  fd_set *__readfds;
  __fd_mask *p_Var1;
  char *__ptr;
  string *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  ostream *poVar7;
  long lVar8;
  fd_set *pfVar9;
  fd_set *pfVar10;
  Tank *this_00;
  int __fd;
  byte bVar11;
  socklen_t sockaddrLength;
  char *remoteAddr;
  fd_set *local_60;
  string *local_58;
  sockaddr_in sockaddr;
  
  bVar11 = 0;
  if (this->serverCreated == false) {
    bVar3 = createServer(this);
    this->serverCreated = bVar3;
  }
  local_60 = &this->master;
  __readfds = &this->tmpSet;
  local_58 = (string *)&this->command;
  iVar4 = this->fdMax;
  while( true ) {
    pfVar9 = local_60;
    pfVar10 = __readfds;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pfVar10->fds_bits[0] = pfVar9->fds_bits[0];
      pfVar9 = (fd_set *)((long)pfVar9 + (ulong)bVar11 * -0x10 + 8);
      pfVar10 = (fd_set *)((long)pfVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    iVar4 = select(iVar4 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar4 == -1) break;
    this_00 = (Tank *)0x0;
    while( true ) {
      iVar4 = this->fdMax;
      __fd = (int)this_00;
      if (iVar4 < __fd) break;
      if (((ulong)__readfds->fds_bits[(ulong)this_00 >> 6] >> ((ulong)this_00 & 0x3f) & 1) != 0) {
        if (__fd == this->listener) {
          if (this->clientConnected == false) {
            sockaddrLength = 0x10;
            iVar4 = accept(__fd,(sockaddr *)&sockaddr,&sockaddrLength);
            this->newSock = iVar4;
            if (iVar4 == -1) {
              puts("Cannot accept connection");
              return;
            }
            p_Var1 = (this->master).fds_bits + iVar4 / 0x40;
            *p_Var1 = *p_Var1 | 1L << ((byte)iVar4 & 0x3f);
            if (this->fdMax < iVar4) {
              this->fdMax = iVar4;
            }
            getAddress(this_00,(sockaddr *)&sockaddr,&remoteAddr);
            __ptr = remoteAddr;
            printf("Connection accepted from IP %s\n",remoteAddr);
            free(__ptr);
          }
          else {
            std::operator<<((ostream *)&std::cerr,"Different client tried to connect");
          }
        }
        else {
          sVar6 = recv(__fd,&remoteAddr,2,0);
          uVar5 = (uint)sVar6;
          if ((int)uVar5 < 1) {
            if (uVar5 == 0) {
              printf("Socket %d is closed\n",this_00);
            }
            else {
              perror("recv");
            }
            close(__fd);
            local_60->fds_bits[(ulong)this_00 >> 6] =
                 local_60->fds_bits[(ulong)this_00 >> 6] & ~(1L << ((byte)this_00 & 0x3f));
          }
          else {
            sVar6 = send(__fd,&remoteAddr,(ulong)(uVar5 & 0x7fffffff),0);
            if (sVar6 == -1) {
              perror("send");
            }
            std::__cxx11::string::string
                      ((string *)&sockaddr,(char *)&remoteAddr,(allocator *)&sockaddrLength);
            psVar2 = local_58;
            std::__cxx11::string::operator=(local_58,(string *)&sockaddr);
            std::__cxx11::string::~string((string *)&sockaddr);
            poVar7 = std::operator<<((ostream *)&std::cout,"we got command! ");
            poVar7 = std::operator<<(poVar7,psVar2);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
        }
      }
      this_00 = (Tank *)(ulong)(__fd + 1);
    }
  }
  perror("select");
  return;
}

Assistant:

void Tank::serverLoop()
{
    if(!serverCreated)
        serverCreated = this->createServer();
        // Run until the cows come home
        while (1) {
            // work with copy of master set
            tmpSet = master;
            // wait for data
            if (select(fdMax+1, &tmpSet, NULL, NULL, NULL) == -1) {
                perror("select");
                return;
            }
            // run through the existing connections looking for data to read
            int i;
            for(i = 0; i <= fdMax; i++) {
                // socket i has data to read
                if (FD_ISSET(i, &tmpSet)) {
                    if (i == listener) {
                        if(!clientConnected)
                        {
                            // handle new connections
                            struct sockaddr_in sockaddr;
                            socklen_t sockaddrLength = sizeof(sockaddr);
                            newSock = accept(listener, (struct sockaddr*) &sockaddr, &sockaddrLength);
                            if (newSock == -1) {
                                printf("Cannot accept connection\n");
                                return;
                            }
                            // add to master set
                            FD_SET(newSock, &master);
                            // watch out for new maximum
                            if (newSock > fdMax) {
                                fdMax = newSock;
                            }
                            char *remoteAddr;
                            getAddress((struct sockaddr*) &sockaddr, &remoteAddr);
                            printf("Connection accepted from IP %s\n", remoteAddr);
                            free(remoteAddr);
                        }
                        else
                        {
                            std::cerr << "Different client tried to connect";
                        }
                    } else {
                        // handle data from a client
                        int readBytes;
                        char buf[2];
                        if ((readBytes = recv(i, buf, sizeof buf, 0)) <= 0) {
                            // got error or connection closed by client
                            if (readBytes == 0) {
                            // connection closed
                            printf("Socket %d is closed\n", i);
                            } else {
                                perror("recv");
                            }
                            close(i); // bye!
                            FD_CLR(i, &master); // remove from master set
                        } else {
                            // we got some data from a client
                                        if (send(i, buf, readBytes, 0) == -1) {
                                            perror("send");
                                        }
                                        this->command = std::string(buf);
                                        std::cout << "we got command! " << this->command << std::endl;
                                    }
                                }
                            }
                        }
                    }
}